

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_gfx_load_mesh(rf_mesh *mesh,_Bool dynamic)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  char *pcVar4;
  
  if (mesh->vao_id == 0) {
    puVar1 = mesh->vbo_id;
    uVar3 = (uint)dynamic * 4 + 0x88e4;
    puVar1[3] = 0;
    puVar1[4] = 0;
    puVar1[5] = 0;
    puVar1[6] = 0;
    puVar1[0] = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    (*(rf__ctx->field_0).gfx_ctx.gl.GenVertexArrays)(1,&mesh->vao_id);
    (*(rf__ctx->field_0).gfx_ctx.gl.BindVertexArray)(mesh->vao_id);
    (*(rf__ctx->field_0).gfx_ctx.gl.GenBuffers)(1,mesh->vbo_id);
    (*(rf__ctx->field_0).gfx_ctx.gl.BindBuffer)(0x8892,*mesh->vbo_id);
    (*(rf__ctx->field_0).gfx_ctx.gl.BufferData)
              (0x8892,(long)mesh->vertex_count * 0xc,mesh->vertices,uVar3);
    (*(rf__ctx->field_0).gfx_ctx.gl.VertexAttribPointer)(0,3,0x1406,'\0',0,(void *)0x0);
    (*(rf__ctx->field_0).gfx_ctx.gl.EnableVertexAttribArray)(0);
    (*(rf__ctx->field_0).gfx_ctx.gl.GenBuffers)(1,mesh->vbo_id + 1);
    (*(rf__ctx->field_0).gfx_ctx.gl.BindBuffer)(0x8892,mesh->vbo_id[1]);
    (*(rf__ctx->field_0).gfx_ctx.gl.BufferData)
              (0x8892,(long)mesh->vertex_count << 3,mesh->texcoords,uVar3);
    (*(rf__ctx->field_0).gfx_ctx.gl.VertexAttribPointer)(1,2,0x1406,'\0',0,(void *)0x0);
    (*(rf__ctx->field_0).gfx_ctx.gl.EnableVertexAttribArray)(1);
    if (mesh->normals == (float *)0x0) {
      (*(rf__ctx->field_0).gfx_ctx.gl.VertexAttrib3f)(2,1.0,1.0,1.0);
      lVar2 = 0x12778;
    }
    else {
      (*(rf__ctx->field_0).gfx_ctx.gl.GenBuffers)(1,mesh->vbo_id + 2);
      (*(rf__ctx->field_0).gfx_ctx.gl.BindBuffer)(0x8892,mesh->vbo_id[2]);
      (*(rf__ctx->field_0).gfx_ctx.gl.BufferData)
                (0x8892,(long)mesh->vertex_count * 0xc,mesh->normals,uVar3);
      (*(rf__ctx->field_0).gfx_ctx.gl.VertexAttribPointer)(2,3,0x1406,'\0',0,(void *)0x0);
      lVar2 = 0x12760;
    }
    (**(code **)((long)&(rf__ctx->field_0).current_width + lVar2))(2);
    if (mesh->colors == (uchar *)0x0) {
      (*(rf__ctx->field_0).gfx_ctx.gl.VertexAttrib4f)(3,1.0,1.0,1.0,1.0);
      lVar2 = 0x12778;
    }
    else {
      (*(rf__ctx->field_0).gfx_ctx.gl.GenBuffers)(1,mesh->vbo_id + 3);
      (*(rf__ctx->field_0).gfx_ctx.gl.BindBuffer)(0x8892,mesh->vbo_id[3]);
      (*(rf__ctx->field_0).gfx_ctx.gl.BufferData)
                (0x8892,(long)mesh->vertex_count << 2,mesh->colors,uVar3);
      (*(rf__ctx->field_0).gfx_ctx.gl.VertexAttribPointer)(3,4,0x1401,'\x01',0,(void *)0x0);
      lVar2 = 0x12760;
    }
    (**(code **)((long)&(rf__ctx->field_0).current_width + lVar2))(3);
    if (mesh->tangents == (float *)0x0) {
      (*(rf__ctx->field_0).gfx_ctx.gl.VertexAttrib4f)(4,0.0,0.0,0.0,0.0);
      lVar2 = 0x12778;
    }
    else {
      (*(rf__ctx->field_0).gfx_ctx.gl.GenBuffers)(1,mesh->vbo_id + 4);
      (*(rf__ctx->field_0).gfx_ctx.gl.BindBuffer)(0x8892,mesh->vbo_id[4]);
      (*(rf__ctx->field_0).gfx_ctx.gl.BufferData)
                (0x8892,(long)mesh->vertex_count << 4,mesh->tangents,uVar3);
      (*(rf__ctx->field_0).gfx_ctx.gl.VertexAttribPointer)(4,4,0x1406,'\0',0,(void *)0x0);
      lVar2 = 0x12760;
    }
    (**(code **)((long)&(rf__ctx->field_0).current_width + lVar2))(4);
    if (mesh->texcoords2 == (float *)0x0) {
      (*(rf__ctx->field_0).gfx_ctx.gl.VertexAttrib2f)(5,0.0,0.0);
      lVar2 = 0x12778;
    }
    else {
      (*(rf__ctx->field_0).gfx_ctx.gl.GenBuffers)(1,mesh->vbo_id + 5);
      (*(rf__ctx->field_0).gfx_ctx.gl.BindBuffer)(0x8892,mesh->vbo_id[5]);
      (*(rf__ctx->field_0).gfx_ctx.gl.BufferData)
                (0x8892,(long)mesh->vertex_count << 3,mesh->texcoords2,uVar3);
      (*(rf__ctx->field_0).gfx_ctx.gl.VertexAttribPointer)(5,2,0x1406,'\0',0,(void *)0x0);
      lVar2 = 0x12760;
    }
    (**(code **)((long)&(rf__ctx->field_0).current_width + lVar2))(5);
    if (mesh->indices != (unsigned_short *)0x0) {
      (*(rf__ctx->field_0).gfx_ctx.gl.GenBuffers)(1,mesh->vbo_id + 6);
      (*(rf__ctx->field_0).gfx_ctx.gl.BindBuffer)(0x8893,mesh->vbo_id[6]);
      (*(rf__ctx->field_0).gfx_ctx.gl.BufferData)
                (0x8893,(long)mesh->triangle_count * 6,mesh->indices,uVar3);
    }
    if (mesh->vao_id != 0) {
      rf_log_impl(2,0x17484f);
      return;
    }
    pcVar4 = "rf_mesh could not be uploaded to VRAM (GPU)";
  }
  else {
    pcVar4 = "Trying to re-load an already loaded mesh";
  }
  rf_log_impl(4,(rf_log_type)pcVar4);
  return;
}

Assistant:

RF_API void rf_gfx_load_mesh(rf_mesh* mesh, bool dynamic)
{
    if (mesh->vao_id > 0)
    {
        // Check if mesh has already been loaded in GPU
        RF_LOG(RF_LOG_TYPE_WARNING, "Trying to re-load an already loaded mesh");
        return;
    }

    mesh->vao_id = 0;        // Vertex Array Object
    mesh->vbo_id[0] = 0;     // Vertex positions VBO
    mesh->vbo_id[1] = 0;     // Vertex texcoords VBO
    mesh->vbo_id[2] = 0;     // Vertex normals VBO
    mesh->vbo_id[3] = 0;     // Vertex colors VBO
    mesh->vbo_id[4] = 0;     // Vertex tangents VBO
    mesh->vbo_id[5] = 0;     // Vertex texcoords2 VBO
    mesh->vbo_id[6] = 0;     // Vertex indices VBO

    int draw_hint = GL_STATIC_DRAW;
    if (dynamic) draw_hint = GL_DYNAMIC_DRAW;

    // Initialize Quads VAO (Buffer A)
    rf_gl.GenVertexArrays(1, &mesh->vao_id);
    rf_gl.BindVertexArray(mesh->vao_id);

    // NOTE: Attributes must be uploaded considering default locations points

    // Enable vertex attributes: position (shader-location = 0)
    rf_gl.GenBuffers(1, &mesh->vbo_id[0]);
    rf_gl.BindBuffer(GL_ARRAY_BUFFER, mesh->vbo_id[0]);
    rf_gl.BufferData(GL_ARRAY_BUFFER, sizeof(float) * 3*mesh->vertex_count, mesh->vertices, draw_hint);
    rf_gl.VertexAttribPointer(0, 3, GL_FLOAT, 0, 0, 0);
    rf_gl.EnableVertexAttribArray(0);

    // Enable vertex attributes: texcoords (shader-location = 1)
    rf_gl.GenBuffers(1, &mesh->vbo_id[1]);
    rf_gl.BindBuffer(GL_ARRAY_BUFFER, mesh->vbo_id[1]);
    rf_gl.BufferData(GL_ARRAY_BUFFER, sizeof(float) * 2*mesh->vertex_count, mesh->texcoords, draw_hint);
    rf_gl.VertexAttribPointer(1, 2, GL_FLOAT, 0, 0, 0);
    rf_gl.EnableVertexAttribArray(1);

    // Enable vertex attributes: normals (shader-location = 2)
    if (mesh->normals != NULL)
    {
        rf_gl.GenBuffers(1, &mesh->vbo_id[2]);
        rf_gl.BindBuffer(GL_ARRAY_BUFFER, mesh->vbo_id[2]);
        rf_gl.BufferData(GL_ARRAY_BUFFER, sizeof(float) * 3*mesh->vertex_count, mesh->normals, draw_hint);
        rf_gl.VertexAttribPointer(2, 3, GL_FLOAT, 0, 0, 0);
        rf_gl.EnableVertexAttribArray(2);
    }
    else
    {
        // Default color vertex attribute set to RF_WHITE
        rf_gl.VertexAttrib3f(2, 1.0f, 1.0f, 1.0f);
        rf_gl.DisableVertexAttribArray(2);
    }

    // Default color vertex attribute (shader-location = 3)
    if (mesh->colors != NULL)
    {
        rf_gl.GenBuffers(1, &mesh->vbo_id[3]);
        rf_gl.BindBuffer(GL_ARRAY_BUFFER, mesh->vbo_id[3]);
        rf_gl.BufferData(GL_ARRAY_BUFFER, sizeof(unsigned char) * 4 * mesh->vertex_count, mesh->colors, draw_hint);
        rf_gl.VertexAttribPointer(3, 4, GL_UNSIGNED_BYTE, GL_TRUE, 0, 0);
        rf_gl.EnableVertexAttribArray(3);
    }
    else
    {
        // Default color vertex attribute set to RF_WHITE
        rf_gl.VertexAttrib4f(3, 1.0f, 1.0f, 1.0f, 1.0f);
        rf_gl.DisableVertexAttribArray(3);
    }

    // Default tangent vertex attribute (shader-location = 4)
    if (mesh->tangents != NULL)
    {
        rf_gl.GenBuffers(1, &mesh->vbo_id[4]);
        rf_gl.BindBuffer(GL_ARRAY_BUFFER, mesh->vbo_id[4]);
        rf_gl.BufferData(GL_ARRAY_BUFFER, sizeof(float) * 4 * mesh->vertex_count, mesh->tangents, draw_hint);
        rf_gl.VertexAttribPointer(4, 4, GL_FLOAT, 0, 0, 0);
        rf_gl.EnableVertexAttribArray(4);
    }
    else
    {
        // Default tangents vertex attribute
        rf_gl.VertexAttrib4f(4, 0.0f, 0.0f, 0.0f, 0.0f);
        rf_gl.DisableVertexAttribArray(4);
    }

    // Default texcoord2 vertex attribute (shader-location = 5)
    if (mesh->texcoords2 != NULL)
    {
        rf_gl.GenBuffers(1, &mesh->vbo_id[5]);
        rf_gl.BindBuffer(GL_ARRAY_BUFFER, mesh->vbo_id[5]);
        rf_gl.BufferData(GL_ARRAY_BUFFER, sizeof(float) * 2*mesh->vertex_count, mesh->texcoords2, draw_hint);
        rf_gl.VertexAttribPointer(5, 2, GL_FLOAT, 0, 0, 0);
        rf_gl.EnableVertexAttribArray(5);
    }
    else
    {
        // Default texcoord2 vertex attribute
        rf_gl.VertexAttrib2f(5, 0.0f, 0.0f);
        rf_gl.DisableVertexAttribArray(5);
    }

    if (mesh->indices != NULL)
    {
        rf_gl.GenBuffers(1, &mesh->vbo_id[6]);
        rf_gl.BindBuffer(GL_ELEMENT_ARRAY_BUFFER, mesh->vbo_id[6]);
        rf_gl.BufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(unsigned short)*mesh->triangle_count * 3, mesh->indices, draw_hint);
    }

    if (mesh->vao_id > 0) RF_LOG(RF_LOG_TYPE_INFO, "[VAO ID %i] rf_mesh uploaded successfully to VRAM (GPU)", mesh->vao_id);
    else RF_LOG(RF_LOG_TYPE_WARNING, "rf_mesh could not be uploaded to VRAM (GPU)");
}